

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_srv_cm.c
# Opt level: O1

int isobusfs_srv_rx_cg_cm(isobusfs_srv_priv *priv,isobusfs_msg *msg)

{
  uint8_t uVar1;
  int iVar2;
  wchar_t wVar3;
  isobusfs_srv_client *piVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  size_t buf_size;
  byte bVar9;
  char *pcVar10;
  undefined8 uVar11;
  uint8_t *__src;
  long lVar12;
  isobusfs_srv_volume *piVar13;
  char isobusfs_volume_path [254];
  undefined1 local_123c;
  undefined1 local_123b;
  undefined1 local_1239;
  ushort local_1238;
  undefined1 local_1236 [254];
  uint8_t local_1138 [256];
  char local_1038;
  undefined1 local_1037;
  undefined2 local_1036;
  undefined4 local_1034;
  
  bVar9 = msg->buf[0] & 0xf;
  if (bVar9 == 2) {
    if (priv->server_version < 3) goto LAB_00103e69;
    memset(&local_123c,0,0x104);
    local_123c = 2;
    uVar6 = (ulong)*(ushort *)(msg->buf + 2);
    __src = msg->buf + 4;
    isobusfs_log(4,"< rx volume status request. mode: %x, length: %d, name: %s",msg->buf[1],uVar6,
                 __src);
    piVar4 = isobusfs_srv_get_client_by_msg(priv,msg);
    if (piVar4 == (isobusfs_srv_client *)0x0) {
      pcVar10 = "can\'t find client";
LAB_00103f9b:
      isobusfs_log(2,pcVar10);
      local_1239 = 0x2c;
    }
    else {
      if (uVar6 == 0) {
        __src = (uint8_t *)piVar4->current_dir;
        uVar6 = 0x1000;
      }
      if (((*__src != '\\') || (__src[1] != '\\')) || (__src[2] == '\0')) {
        pcVar10 = "can\'t extract volume name";
        goto LAB_00103f9b;
      }
      sVar8 = 3;
      if (uVar6 < 3) {
        sVar8 = uVar6;
      }
      memcpy(local_1138,__src,sVar8);
      uVar5 = 0;
      uVar7 = uVar5;
      if (uVar6 != 0) {
        do {
          uVar1 = __src[uVar5];
          uVar7 = uVar5;
          if ((uVar1 == '\0') || (uVar1 == '\\')) break;
          if (uVar5 == 0xfd) {
            uVar7 = 0xfd;
            break;
          }
          local_1138[uVar5] = uVar1;
          uVar5 = uVar5 + 1;
          uVar7 = uVar6;
        } while (uVar6 != uVar5);
      }
      local_1138[uVar7] = '\0';
      sVar8 = strlen((char *)local_1138);
      local_1238 = (ushort)sVar8;
      memcpy(local_1236,local_1138,sVar8 + 1);
      wVar3 = isobusfs_path_to_linux_path
                        ((isobusfs_srv_priv_conflict *)priv,(char *)local_1138,0xfe,&local_1038,
                         0x1000);
      if (wVar3 < L'\0') {
        isobusfs_log(2,"can\'t convert %s path to linux path",local_1138);
LAB_00104178:
        local_1239 = 4;
      }
      else {
        iVar2 = isobusfs_cmn_dh_validate_dir_path(&local_1038,0);
        local_1239 = 2;
        if (iVar2 < 0) goto LAB_00103faa;
        lVar12 = (long)priv->volume_count;
        if (0 < lVar12) {
          piVar13 = priv->volumes;
          do {
            iVar2 = strncmp(piVar13->name,(char *)local_1138,0xfe);
            if (iVar2 == 0) goto LAB_00104118;
            piVar13 = piVar13 + 1;
            lVar12 = lVar12 + -1;
          } while (lVar12 != 0);
        }
        piVar13 = (isobusfs_srv_volume *)0x0;
LAB_00104118:
        if (piVar13 == (isobusfs_srv_volume *)0x0) goto LAB_00104178;
        if ((msg->buf[1] & 2) == 0) {
          if ((msg->buf[1] & 1) == 0) {
LAB_00104190:
            local_123b = 0 < piVar13->refcount;
            local_1239 = 0;
          }
          else {
            lVar12 = 3;
            do {
              if (piVar13->clients[lVar12 + -3] == piVar4) goto LAB_00104190;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 0xf0);
            lVar12 = 3;
            do {
              if (piVar13->clients[lVar12 + -3] == (isobusfs_srv_client *)0x0) {
                piVar13->clients[lVar12 + -3] = piVar4;
                piVar13->refcount = piVar13->refcount + 1;
                goto LAB_00104190;
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 != 0xf0);
          }
        }
        else if (piVar13->removable == true) goto LAB_00104190;
      }
    }
LAB_00103faa:
    uVar6 = (ulong)local_1238;
    buf_size = uVar6 + 6;
    if (uVar6 < 2) {
      memset(local_1236 + uVar6,0xff,2 - uVar6);
      buf_size = 8;
    }
    else if (0xfffa < local_1238) {
      isobusfs_log(2,"volume status response too long");
      local_1239 = 0x2b;
      buf_size = 0x10000;
    }
    iVar2 = isobusfs_srv_sendto(priv,msg,&local_123c,buf_size);
    if (-1 < iVar2) {
      isobusfs_log(4,
                   "> tx volume status response. status: %d, error code: %d, name len: %d, name: %s"
                   ,local_123b,local_1239,local_1238);
      return 0;
    }
    pcVar10 = "can\'t send volume status response";
  }
  else {
    if (bVar9 != 1) {
      if ((msg->buf[0] & 0xf) == 0) {
        isobusfs_log(4,"< rx ccm version: %d",msg->buf[1]);
        return 0;
      }
LAB_00103e69:
      isobusfs_srv_send_error(priv,msg,ISOBUSFS_ERR_FUNC_NOT_SUPPORTED);
      isobusfs_log(2,"%s: unsupported function: %i","isobusfs_srv_rx_cg_cm",bVar9);
      return 0;
    }
    local_1038 = '\x01';
    local_1037 = (undefined1)priv->server_version;
    local_1036 = 0xff;
    local_1034 = 0xffffffff;
    iVar2 = isobusfs_srv_sendto(priv,msg,&local_1038,8);
    if (-1 < iVar2) {
      pcVar10 = "> tx property response";
      iVar2 = 0;
      uVar11 = 4;
      goto LAB_0010404f;
    }
    pcVar10 = "can\'t send property response";
  }
  uVar11 = 2;
LAB_0010404f:
  isobusfs_log(uVar11,pcVar10);
  return iVar2;
}

Assistant:

int isobusfs_srv_rx_cg_cm(struct isobusfs_srv_priv *priv,
			  struct isobusfs_msg *msg)
{
	enum isobusfs_cm_cl_to_fs_function func =
		isobusfs_buf_to_function(msg->buf);
	int ret = 0;

	/* Process the received function code and delegate to appropriate
	 * handlers
	 */
	switch (func) {
	case ISOBUSFS_CM_F_CC_MAINTENANCE:
		ret = isobusfs_srv_handle_ccm(priv, msg);
		break;
	case ISOBUSFS_CM_GET_FS_PROPERTIES:
		ret = isobusfs_srv_property_res(priv, msg);
		break;
	case ISOBUSFS_CM_VOLUME_STATUS_REQ:
		if (priv->server_version < 3)
			goto not_supported;

		ret = isobusfs_srv_volume_status_resp(priv, msg);
		break;
	default:
		goto not_supported;
	}

	return ret;

not_supported:
	/* Handle unsupported functions */
	isobusfs_srv_send_error(priv, msg, ISOBUSFS_ERR_FUNC_NOT_SUPPORTED);

	pr_warn("%s: unsupported function: %i", __func__, func);

	/* Not a critical error */
	return 0;
}